

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float32 floatx80_to_float32_arm(floatx80 a,float_status *status)

{
  int iVar1;
  float32 fVar2;
  ushort uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  uVar5 = a.low;
  uVar3 = a.high & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)uVar5)
  {
    status->float_exception_flags = status->float_exception_flags | 1;
    return 0x7fc00000;
  }
  uVar4 = (a._8_8_ & 0xffff) >> 0xf;
  if (uVar3 == 0x7fff) {
    iVar1 = (int)uVar4;
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
      if ((((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0) &&
         (((undefined1  [16])a & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0)) {
        status->float_exception_flags = status->float_exception_flags | 1;
      }
      uVar4 = 0x8000000000000000;
      if ((long)uVar5 < 0) {
        uVar4 = uVar5 * 2;
      }
      iVar6 = -0x80000000;
      if ((long)uVar5 < 0) {
        iVar6 = iVar1 << 0x1f;
      }
      fVar2 = iVar6 + 0x7f800000 + (uint)(uVar4 >> 0x29);
      if (status->default_nan_mode != '\0') {
        fVar2 = 0x7fc00000;
      }
      if (uVar4 >> 0x29 == 0) {
        fVar2 = 0x7fc00000;
      }
      return fVar2;
    }
    return iVar1 << 0x1f | 0x7f800000;
  }
  uVar5 = (ulong)(((undefined1  [16])a & (undefined1  [16])0x1ffffffff) != (undefined1  [16])0x0) |
          uVar5 >> 0x21;
  iVar6 = uVar3 - 0x3f81;
  iVar1 = 0;
  if (uVar5 != 0) {
    iVar1 = iVar6;
  }
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0) {
    iVar1 = iVar6;
  }
  fVar2 = roundAndPackFloat32((flag)uVar4,iVar1,(uint32_t)uVar5,status);
  return fVar2;
}

Assistant:

float32 floatx80_to_float32(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return float32_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( (uint64_t) ( aSig<<1 ) ) {
            return commonNaNToFloat32(floatx80ToCommonNaN(a, status), status);
        }
        return packFloat32( aSign, 0xFF, 0 );
    }
    shift64RightJamming( aSig, 33, &aSig );
    if ( aExp || aSig ) aExp -= 0x3F81;
    return roundAndPackFloat32(aSign, aExp, aSig, status);

}